

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O3

bool __thiscall EnumType::has_case(EnumType *this,string *case_name)

{
  long lVar1;
  pointer ppVar2;
  pointer __s2;
  size_t __n;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_type *psVar7;
  bool bVar8;
  
  ppVar2 = (this->cases).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->cases).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2;
  if (lVar4 == 0) {
    bVar8 = false;
  }
  else {
    lVar4 = lVar4 >> 3;
    uVar6 = lVar4 * -0x3333333333333333;
    __s2 = (case_name->_M_dataplus)._M_p;
    __n = case_name->_M_string_length;
    psVar7 = &(ppVar2->first)._M_string_length;
    bVar8 = true;
    uVar5 = 1;
    do {
      if (*psVar7 == __n) {
        if (__n == 0) {
          return bVar8;
        }
        iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar7 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar3 == 0) {
          return bVar8;
        }
      }
      bVar8 = uVar5 < uVar6;
      lVar1 = uVar5 + (lVar4 * 0x3333333333333333 - (ulong)(uVar6 == 0));
      uVar5 = uVar5 + 1;
      psVar7 = psVar7 + 5;
    } while (lVar1 != 0);
  }
  return bVar8;
}

Assistant:

bool has_case(const std::string& case_name) const {
		for (std::size_t i = 0; i < cases.size(); ++i) {
			if (cases[i].first == case_name) {
				return true;
			}
		}
		return false;
	}